

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proof.cc
# Opt level: O2

void __thiscall gss::innards::Proof::recover_at_least_one_constraint(Proof *this,int p)

{
  _Head_base<0UL,_gss::innards::Proof::Imp_*,_false> _Var1;
  iterator iVar2;
  ostream *poVar3;
  _Base_ptr p_Var4;
  long local_20;
  
  local_20 = (long)p;
  iVar2 = std::
          _Rb_tree<long,_std::pair<const_long,_std::tuple<long,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::_Select1st<std::pair<const_long,_std::tuple<long,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<long>,_std::allocator<std::pair<const_long,_std::tuple<long,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          ::find(&(((this->_imp)._M_t.
                    super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                    .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)->
                  at_least_one_value_constraints)._M_t,&local_20);
  _Var1._M_head_impl =
       (this->_imp)._M_t.
       super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
       ._M_t.
       super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
       .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl;
  if ((iVar2._M_node !=
       (_Base_ptr)((long)&(_Var1._M_head_impl)->at_least_one_value_constraints + 8U)) &&
     (iVar2._M_node[2]._M_parent == (_Base_ptr)0x0)) {
    std::operator<<((ostream *)((_Var1._M_head_impl)->proof_stream)._M_t,"# 0\n");
    poVar3 = std::operator<<((ostream *)
                             (((this->_imp)._M_t.
                               super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                               .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>.
                              _M_head_impl)->proof_stream)._M_t,"ia ");
    poVar3 = std::operator<<(poVar3,(string *)&iVar2._M_node[1]._M_parent);
    std::operator<<(poVar3," ;\n");
    _Var1._M_head_impl =
         (this->_imp)._M_t.
         super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
         ._M_t.
         super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
         .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl;
    p_Var4 = (_Base_ptr)((_Var1._M_head_impl)->proof_line + 1);
    (_Var1._M_head_impl)->proof_line = (long)p_Var4;
    iVar2._M_node[2]._M_parent = p_Var4;
    poVar3 = std::operator<<((ostream *)((_Var1._M_head_impl)->proof_stream)._M_t,"# ");
    poVar3 = (ostream *)
             std::ostream::operator<<
                       (poVar3,((this->_imp)._M_t.
                                super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                                .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>.
                               _M_head_impl)->active_level);
    std::operator<<(poVar3,'\n');
  }
  return;
}

Assistant:

auto Proof::recover_at_least_one_constraint(int p) -> void
{
    auto it = _imp->at_least_one_value_constraints.find(p);
    if (it != _imp->at_least_one_value_constraints.end() && 0 == get<1>(it->second)) {
        *_imp->proof_stream << "# 0\n";
        *_imp->proof_stream << "ia " << get<2>(it->second) << " ;\n";
        get<1>(it->second) = ++_imp->proof_line;
        *_imp->proof_stream << "# " << _imp->active_level << '\n';
    }
}